

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

ScriptPubKeyMan * __thiscall
wallet::CWallet::GetScriptPubKeyMan(CWallet *this,OutputType *type,bool internal)

{
  _Base_ptr p_Var1;
  ScriptPubKeyMan *pSVar2;
  _Base_ptr p_Var3;
  undefined7 in_register_00000011;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *pmVar4;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  
  pmVar4 = &this->m_internal_spk_managers;
  if ((int)CONCAT71(in_register_00000011,internal) == 0) {
    pmVar4 = &this->m_external_spk_managers;
  }
  p_Var3 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  p_Var1 = &p_Var5->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if ((int)*type <= (int)p_Var3[1]._M_color) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)*type];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var5) &&
     (p_Var3 = p_Var1, (int)*type < (int)p_Var1[1]._M_color)) {
    p_Var3 = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    pSVar2 = (ScriptPubKeyMan *)0x0;
  }
  else {
    pSVar2 = (ScriptPubKeyMan *)p_Var3[1]._M_parent;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return pSVar2;
}

Assistant:

ScriptPubKeyMan* CWallet::GetScriptPubKeyMan(const OutputType& type, bool internal) const
{
    const std::map<OutputType, ScriptPubKeyMan*>& spk_managers = internal ? m_internal_spk_managers : m_external_spk_managers;
    std::map<OutputType, ScriptPubKeyMan*>::const_iterator it = spk_managers.find(type);
    if (it == spk_managers.end()) {
        return nullptr;
    }
    return it->second;
}